

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall UdpLayer::reset(UdpLayer *this,sockaddr_in *local)

{
  long lVar1;
  bdStackMutex local_20;
  bdStackMutex stack;
  sockaddr_in *local_local;
  UdpLayer *this_local;
  
  stack.mMtx = (bdMutex *)local;
  bdStackMutex::bdStackMutex(&local_20,&this->sockMtx);
  this->stopThread = true;
  bdStackMutex::~bdStackMutex(&local_20);
  (*(this->super_bdThread)._vptr_bdThread[4])();
  closeSocket(this);
  lVar1 = ((stack.mMtx)->realMutex).__align;
  (this->laddr).sin_family = (short)lVar1;
  (this->laddr).sin_port = (short)((ulong)lVar1 >> 0x10);
  (this->laddr).sin_addr = (in_addr)(int)((ulong)lVar1 >> 0x20);
  *(undefined8 *)(this->laddr).sin_zero = *(undefined8 *)((long)&(stack.mMtx)->realMutex + 8);
  this->errorState = 0;
  this->ttl = 0x40;
  openSocket(this);
  return 1;
}

Assistant:

int UdpLayer::reset(struct sockaddr_in &local) {
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset()" << std::endl;
#endif

	/* stop the old thread */
	{
		bdStackMutex stack(sockMtx);   /********** LOCK MUTEX *********/
#ifdef DEBUG_UDP_LAYER
		std::cerr << "UdpLayer::reset() setting stopThread flag" << std::endl;
#endif
		stopThread = true;
	}
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() joining" << std::endl;
#endif

	join(); 

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() closing socket" << std::endl;
#endif
	closeSocket();

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() resetting variables" << std::endl;
#endif
	laddr = local;
	errorState = 0;
	ttl = UDP_DEF_TTL;

#ifdef DEBUG_UDP_LAYER
	std::cerr << "UdpLayer::reset() opening socket" << std::endl;
#endif
	openSocket();

	return 1 ;
}